

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::
ValidationErrorTest_ExtensionDeclarationsMismatchFullNameAllowed_Test::
~ValidationErrorTest_ExtensionDeclarationsMismatchFullNameAllowed_Test
          (ValidationErrorTest_ExtensionDeclarationsMismatchFullNameAllowed_Test *this)

{
  (this->super_ValidationErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_018e2b28;
  DescriptorPool::~DescriptorPool(&(this->super_ValidationErrorTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ExtensionDeclarationsMismatchFullNameAllowed) {
  // Make sure that extension declaration names and types are not validated
  // outside of protoc. This is important for allowing extensions to be renamed
  // safely.
  pool_.EnforceExtensionDeclarations(ExtDeclEnforcementLevel::kNoEnforcement);
  BuildFile(
      R"pb(
        name: "foo.proto"
        package: "ext.test"
        message_type {
          name: "Foo"
          extension_range {
            start: 11
            end: 999
            options: {
              declaration: {
                number: 100
                full_name: ".ext.test.buz"
                type: ".ext.test.Bar"
              }
            }
          }
        }
        message_type { name: "Bar" }
        extension { extendee: "Foo" name: "foo" number: 100 type_name: "Bar" }
      )pb");
}